

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

string * __thiscall
BayesianGameCollaborativeGraphical::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameCollaborativeGraphical *this)

{
  pointer pSVar1;
  pointer ppBVar2;
  char cVar3;
  string *psVar4;
  ostream *poVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  stringstream ss;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (this->_m_nrLRFs != 0) {
    uVar7 = 1;
    uVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"LRF function ",0xd);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Agent scope ",0xc);
      pSVar1 = (this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
              -0x5555555555555555;
      if (uVar6 < uVar8 || uVar6 - uVar8 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
      }
      PrintTools::SoftPrintVector<Scope>(&local_1e0,pSVar1 + uVar8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length
                         );
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      ppBVar2 = (this->_m_LRFs).
                super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_LRFs).
                        super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar2 >> 3) <= uVar8) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
      }
      (**(code **)(*(long *)&(ppBVar2[uVar8]->super_BayesianGameIdenticalPayoffInterface).
                             super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure +
                  0x90))(&local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      cVar3 = (char)(ostream *)local_1a8;
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      uVar8 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar8 < this->_m_nrLRFs);
  }
  psVar4 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

string BayesianGameCollaborativeGraphical::SoftPrint() const
{
    stringstream ss;
    //ss << BayesianGameBase::SoftPrint();    
    for(Index e=0; e < _m_nrLRFs; e++)
    {
        ss << "LRF function " << e << ":" << endl;
        ss << "Agent scope " << SoftPrintVector(_m_agentScopes.at(e)) << endl;
        ss << _m_LRFs.at(e)->SoftPrint();
        ss << endl;
    }
    return(ss.str());
}